

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O3

StringRef llvm::sys::detail::getHostCPUNameForS390x(StringRef ProcCpuinfoContent)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_long_long *Result;
  long lVar7;
  char *pcVar8;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Separator;
  StringRef SVar9;
  unsigned_long_long ULLVal;
  SmallVector<llvm::StringRef,_32U> Lines;
  SmallVector<llvm::StringRef,_32U> CPUFeatures;
  StringRef local_470;
  StringRef local_460;
  SmallVectorImpl<llvm::StringRef> local_450;
  undefined1 local_440 [512];
  SmallVectorImpl<llvm::StringRef> local_240;
  undefined1 local_230 [512];
  
  local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_440;
  local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  Result = (unsigned_long_long *)0xffffffff;
  Separator.Length = 1;
  Separator.Data = "\n";
  StringRef::split(&local_460,&local_450,Separator,-1,true);
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  uVar4 = local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_230;
  if (uVar4 != 0) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      if ((local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) <= uVar6) goto LAB_00184eea;
      if (((7 < *(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                 super_SmallVectorBase.BeginX + lVar7)) &&
          (*(long *)((StringRef *)
                    ((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                           super_SmallVectorBase.BeginX + lVar7 + -8))->Data == 0x7365727574616566))
         && (Str.Length = 1, Str.Data = ":",
            sVar3 = StringRef::find((StringRef *)
                                    ((long)local_450.
                                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                           super_SmallVectorBase.BeginX + lVar7 + -8),Str,0),
            sVar3 != 0xffffffffffffffff)) {
        if (local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
            (uint)uVar6) goto LAB_00184eea;
        if (*(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + lVar7) <= sVar3) goto LAB_00184f09;
        local_470.Length =
             *(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar7) - (sVar3 + 1);
        local_470.Data =
             (char *)(sVar3 + 1 +
                     *(long *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                     super_SmallVectorBase.BeginX + lVar7 + -8));
        Result = (unsigned_long_long *)0x1;
        StringRef::split(&local_470,&local_240,' ',-1,true);
        break;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar4 != uVar6);
    if ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) == 0) {
      bVar1 = false;
    }
    else {
      lVar7 = 0;
      bVar1 = false;
      do {
        if ((*(long *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + lVar7 + 8) == 2) &&
           (**(short **)
              ((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX + lVar7) == 0x7876)) {
          bVar1 = true;
        }
        lVar7 = lVar7 + 0x10;
      } while ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
               0xffffffff) << 4 != lVar7);
    }
    if ((local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) != 0) {
      lVar7 = 0;
      uVar5 = 0;
      do {
        if ((9 < *(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar7 + 8)) &&
           ((short)(*(long **)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                     super_SmallVectorBase.BeginX + lVar7))[1] == 0x2072 &&
            **(long **)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar7) == 0x6f737365636f7270)) {
          Str_00.Length = 10;
          Str_00.Data = "machine = ";
          sVar3 = StringRef::find((StringRef *)
                                  ((long)local_450.
                                         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                         super_SmallVectorBase.BeginX + lVar7),Str_00,0);
          if (sVar3 == 0xffffffffffffffff) break;
          if (local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
              uVar5) {
LAB_00184eea:
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                         );
          }
          uVar4 = sVar3 + 10;
          Str_01.Data = (char *)(*(ulong *)((long)local_450.
                                                  super_SmallVectorTemplateBase<llvm::StringRef,_true>
                                                  .
                                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                                  .super_SmallVectorBase.BeginX + lVar7 + 8) - uVar4
                                );
          if (*(ulong *)((long)local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + lVar7 + 8) < uVar4) {
LAB_00184f09:
            __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                          ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
          }
          Str_01.Length = 10;
          bVar2 = getAsUnsignedInteger
                            ((llvm *)(uVar4 + *(long *)((long)local_450.
                                                                                                                            
                                                  super_SmallVectorTemplateBase<llvm::StringRef,_true>
                                                  .
                                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                                  .super_SmallVectorBase.BeginX + lVar7)),Str_01,
                             (uint)&local_470,Result);
          if ((bVar2) || ((ulong)local_470.Data >> 0x20 != 0)) break;
          if (local_470.Data < (char *)0xf42) {
            if (local_470.Data < (char *)0xb94) {
              if (local_470.Data < (char *)0xb0b) {
                if ((char *)0xb00 < local_470.Data) {
                  sVar3 = 4;
                  pcVar8 = "z196";
                  goto LAB_00184d79;
                }
                break;
              }
            }
            else if (bVar1) {
              sVar3 = 3;
              pcVar8 = "z13";
              goto LAB_00184d79;
            }
          }
          else if (bVar1) {
            sVar3 = 3;
            pcVar8 = "z14";
            goto LAB_00184d79;
          }
          sVar3 = 5;
          pcVar8 = "zEC12";
          goto LAB_00184d79;
        }
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 0x10;
      } while ((local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
               0xffffffff) << 4 != lVar7);
    }
  }
  sVar3 = 7;
  pcVar8 = "generic";
LAB_00184d79:
  if ((undefined1 *)
      local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_230) {
    free(local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  if ((undefined1 *)
      local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_440) {
    free(local_450.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  SVar9.Length = sVar3;
  SVar9.Data = pcVar8;
  return SVar9;
}

Assistant:

StringRef sys::detail::getHostCPUNameForS390x(StringRef ProcCpuinfoContent) {
  // STIDP is a privileged operation, so use /proc/cpuinfo instead.

  // The "processor 0:" line comes after a fair amount of other information,
  // including a cache breakdown, but this should be plenty.
  SmallVector<StringRef, 32> Lines;
  ProcCpuinfoContent.split(Lines, "\n");

  // Look for the CPU features.
  SmallVector<StringRef, 32> CPUFeatures;
  for (unsigned I = 0, E = Lines.size(); I != E; ++I)
    if (Lines[I].startswith("features")) {
      size_t Pos = Lines[I].find(":");
      if (Pos != StringRef::npos) {
        Lines[I].drop_front(Pos + 1).split(CPUFeatures, ' ');
        break;
      }
    }

  // We need to check for the presence of vector support independently of
  // the machine type, since we may only use the vector register set when
  // supported by the kernel (and hypervisor).
  bool HaveVectorSupport = false;
  for (unsigned I = 0, E = CPUFeatures.size(); I != E; ++I) {
    if (CPUFeatures[I] == "vx")
      HaveVectorSupport = true;
  }

  // Now check the processor machine type.
  for (unsigned I = 0, E = Lines.size(); I != E; ++I) {
    if (Lines[I].startswith("processor ")) {
      size_t Pos = Lines[I].find("machine = ");
      if (Pos != StringRef::npos) {
        Pos += sizeof("machine = ") - 1;
        unsigned int Id;
        if (!Lines[I].drop_front(Pos).getAsInteger(10, Id)) {
          if (Id >= 3906 && HaveVectorSupport)
            return "z14";
          if (Id >= 2964 && HaveVectorSupport)
            return "z13";
          if (Id >= 2827)
            return "zEC12";
          if (Id >= 2817)
            return "z196";
        }
      }
      break;
    }
  }

  return "generic";
}